

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_d2i_fp.cc
# Opt level: O3

void * ASN1_item_d2i_bio(ASN1_ITEM *it,BIO *in,void *x)

{
  int iVar1;
  ASN1_VALUE *pAVar2;
  uint8_t *data;
  size_t len;
  uint8_t *ptr;
  uint8_t *local_28;
  size_t local_20;
  uint8_t *local_18;
  
  iVar1 = BIO_read_asn1((BIO *)in,&local_28,&local_20,0x7fffffff);
  if (iVar1 == 0) {
    pAVar2 = (ASN1_VALUE *)0x0;
  }
  else {
    local_18 = local_28;
    pAVar2 = ASN1_item_d2i((ASN1_VALUE **)x,&local_18,local_20,it);
    OPENSSL_free(local_28);
  }
  return pAVar2;
}

Assistant:

void *ASN1_item_d2i_bio(const ASN1_ITEM *it, BIO *in, void *x) {
  uint8_t *data;
  size_t len;
  // Historically, this function did not impose a limit in OpenSSL and is used
  // to read CRLs, so we leave this without an external bound.
  if (!BIO_read_asn1(in, &data, &len, INT_MAX)) {
    return NULL;
  }
  const uint8_t *ptr = data;
  void *ret = ASN1_item_d2i(reinterpret_cast<ASN1_VALUE **>(x), &ptr, len, it);
  OPENSSL_free(data);
  return ret;
}